

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::ScanNodes(BasePort *this)

{
  ostream *poVar1;
  char cVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  uchar *puVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  quadlet_t data;
  uint32_t git_desc;
  uint local_90;
  uint local_8c;
  uchar *local_88;
  ulong local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_88 = this->Node2Board;
  builtin_memcpy(this->Node2Board,
                 "\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10\x10"
                 ,0x40);
  this->IsAllBoardsBroadcastCapable_ = true;
  this->IsAllBoardsRev4_5_ = true;
  this->IsAllBoardsRev4_6_ = true;
  this->IsAllBoardsRev6_ = true;
  this->IsAllBoardsRev7_ = true;
  this->IsAllBoardsRev8_9_ = true;
  this->NumOfNodes_ = 0;
  uVar4 = (*this->_vptr_BasePort[2])();
  poVar7 = this->outStr;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"BasePort::ScanNodes: building node map for ",0x2b);
  uVar15 = (ulong)(uVar4 & 0xffff);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," nodes:",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((short)uVar4 != 0) {
    uVar16 = 0;
    do {
      iVar5 = (*this->_vptr_BasePort[4])(this,uVar16 & 0xffff,4,&local_90,0);
      if ((char)iVar5 == '\0') {
        iVar5 = (*this->_vptr_BasePort[0xf])(this);
        if (iVar5 == 0) {
          poVar7 = this->outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"BasePort::ScanNodes: unable to read from node ",0x2e);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          lVar10 = *(long *)poVar7;
          goto LAB_0010baa5;
        }
      }
      else if ((long)SupportedHardware.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)SupportedHardware.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start == 0) {
LAB_0010ba15:
        poVar7 = this->outStr;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"BasePort::ScanNodes: node ",0x1a)
        ;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," is not a supported board (data = ",0x22);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        lVar10 = *(long *)poVar7;
LAB_0010baa5:
        std::ios::widen((char)*(undefined8 *)(lVar10 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      else {
        uVar8 = (long)SupportedHardware.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)SupportedHardware.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        uVar14 = (ulong)local_90;
        if (*SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start != uVar14) {
          uVar3 = 1;
          do {
            uVar13 = uVar3;
            if (uVar8 + (uVar8 == 0) == uVar13) break;
            uVar3 = uVar13 + 1;
          } while (SupportedHardware.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13] != uVar14);
          if (uVar8 <= uVar13) goto LAB_0010ba15;
        }
        uVar8 = uVar16 & 0xffff;
        iVar5 = (*this->_vptr_BasePort[4])(this,uVar8,7,&local_90);
        if ((char)iVar5 == '\0') {
          poVar7 = this->outStr;
          lVar10 = 0x3f;
          pcVar12 = "BasePort::ScanNodes: unable to read firmware version from node ";
        }
        else {
          local_78 = (ulong)local_90;
          uVar4 = 1;
          if (4 < local_78) {
            iVar5 = (*this->_vptr_BasePort[4])(this,uVar8,0xc,&local_90);
            if ((char)iVar5 == '\0') {
              poVar7 = this->outStr;
              lVar10 = 0x48;
              pcVar12 = "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node ";
              goto LAB_0010bb08;
            }
            uVar4 = BoardIO::GetFpgaVersionMajorFromStatus(local_90);
          }
          iVar5 = (*this->_vptr_BasePort[4])(this,uVar8,0,&local_90);
          if ((char)iVar5 != '\0') {
            uVar6 = local_90 >> 0x18 & 0xf;
            local_80 = (ulong)uVar6;
            this->FpgaVersion[uVar6] = uVar4;
            this->HardwareVersion[uVar6] = uVar14;
            this->FirmwareVersion[uVar6] = local_78;
            local_8c = 0;
            iVar5 = (*this->_vptr_BasePort[4])(this,uVar8,0xf,&local_8c);
            if ((char)iVar5 == '\0') {
              poVar7 = this->outStr;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"BasePort::ScanNodes: unable to read git desc from node ",0x37);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
            poVar7 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  Node ",7);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", BoardId = ",0xc);
            uVar8 = local_80;
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            GetFpgaVersionMajorString_abi_cxx11_(&local_50,this,(uchar)uVar8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", Hardware = ",0xd);
            GetHardwareVersionString_abi_cxx11_(&local_70,this,(uchar)uVar8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", Firmware Version = ",0x15);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (local_8c != 0) {
              uVar4 = local_8c & 8;
              pcVar12 = "-";
              if ((local_8c & 3) != 1) {
                if ((local_8c & 3) == 0) {
                  pcVar12 = "+";
                  if ((local_8c >> 2 & 1) == 0 && uVar4 == 0) goto LAB_0010bc33;
                }
                else {
                  pcVar12 = "?";
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>(this->outStr,pcVar12,1);
              poVar1 = this->outStr;
              std::__ostream_insert<char,std::char_traits<char>>(poVar1," (git-",6);
              lVar10 = *(long *)poVar1;
              *(uint *)(poVar1 + *(long *)(lVar10 + -0x18) + 0x18) =
                   *(uint *)(poVar1 + *(long *)(lVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
              *(undefined8 *)(poVar1 + *(long *)(lVar10 + -0x18) + 0x10) = 7;
              poVar7 = poVar1 + *(long *)(lVar10 + -0x18);
              if (poVar1[*(long *)(lVar10 + -0x18) + 0xe1] == (ostream)0x0) {
                std::ios::widen((char)poVar7);
                poVar7[0xe1] = (ostream)0x1;
              }
              poVar7[0xe0] = (ostream)0x30;
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
              if (uVar4 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>(this->outStr,"*",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>(this->outStr,")",1);
            }
LAB_0010bc33:
            cVar2 = (char)this->outStr;
            std::ios::widen((char)*(undefined8 *)(*(long *)this->outStr + -0x18) + cVar2);
            std::ostream::put(cVar2);
            std::ostream::flush();
            if (this->Node2Board[uVar16] < 0x10) {
              poVar7 = this->outStr;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"    Duplicate entry, previous value = ",0x26);
              plVar9 = (long *)std::ostream::operator<<
                                         ((ostream *)poVar7,(uint)this->Node2Board[uVar16]);
              std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
              std::ostream::put((char)plVar9);
              std::ostream::flush();
            }
            local_88[uVar16] = (uchar)local_80;
            uVar4 = (uint)local_78;
            if (uVar4 < 4) {
              this->IsAllBoardsBroadcastCapable_ = false;
              this->IsAllBoardsRev4_5_ = false;
              this->IsAllBoardsRev4_6_ = false;
LAB_0010bd08:
              this->IsAllBoardsRev6_ = false;
LAB_0010bd0c:
              this->IsAllBoardsRev7_ = false;
LAB_0010bd10:
              this->IsAllBoardsRev8_9_ = false;
            }
            else {
              if (uVar4 < 6) goto LAB_0010bd08;
              this->IsAllBoardsRev4_5_ = false;
              if (uVar4 == 6) goto LAB_0010bd0c;
              this->IsAllBoardsRev4_6_ = false;
              this->IsAllBoardsRev6_ = false;
              if ((uVar4 == 7) || (this->IsAllBoardsRev7_ = false, uVar4 - 10 < 0xfffffffe))
              goto LAB_0010bd10;
            }
            this->NumOfNodes_ = this->NumOfNodes_ + 1;
            goto LAB_0010bb47;
          }
          poVar7 = this->outStr;
          lVar10 = 0x35;
          pcVar12 = "BasePort::ScanNodes: unable to read status from node ";
        }
LAB_0010bb08:
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,lVar10);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
LAB_0010bb47:
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar15);
  }
  poVar7 = this->outStr;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"BasePort::ScanNodes: found ",0x1b);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," boards",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  uVar16 = 0;
  puVar11 = local_88;
  do {
    this->Board2Node[uVar16] = 0x40;
    if (uVar15 != 0) {
      uVar8 = 0x40;
      uVar14 = 0;
      do {
        if (uVar16 == puVar11[uVar14]) {
          if ((ushort)uVar8 < 0x40) {
            poVar7 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"BasePort::ScanNodes: warning: duplicate node id for board ",0x3a);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            puVar11 = local_88;
          }
          this->Board2Node[uVar16] = (nodeid_t)uVar14;
          uVar8 = uVar14 & 0xffffffff;
        }
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x10);
  return this->NumOfNodes_ != 0;
}

Assistant:

bool BasePort::ScanNodes(void)
{
    unsigned int board;
    nodeid_t node;

    // Clear any existing Node2Board
    memset(Node2Board, BoardIO::MAX_BOARDS, sizeof(Node2Board));

    IsAllBoardsBroadcastCapable_ = true;
    IsAllBoardsRev4_5_ = true;
    IsAllBoardsRev4_6_ = true;
    IsAllBoardsRev6_ = true;
    IsAllBoardsRev7_ = true;
    IsAllBoardsRev8_9_ = true;
    NumOfNodes_ = 0;

    nodeid_t max_nodes = InitNodes();

    outStr << "BasePort::ScanNodes: building node map for " << max_nodes << " nodes:" << std::endl;
    // Iterate through all possible nodes
    for (node = 0; node < max_nodes; node++) {
        quadlet_t data;
        unsigned long hver = 0;
        // check hardware version
        if (!ReadQuadletNode(node, BoardIO::HARDWARE_VERSION, data)) {
            if (GetPortType() == PORT_FIREWIRE)
                outStr << "BasePort::ScanNodes: unable to read from node " << node << std::endl;
            continue;
        }
        hver = data;

        if (!HardwareVersionValid(hver)) {
            outStr << "BasePort::ScanNodes: node " << node << " is not a supported board (data = "
                   << std::hex << data << std::dec << ")" << std::endl;
            continue;
        }

        // read firmware version
        unsigned long fver = 0;
        if (!ReadQuadletNode(node, BoardIO::FIRMWARE_VERSION, data)) {
            outStr << "BasePort::ScanNodes: unable to read firmware version from node "
                   << node << std::endl;
            continue;
        }
        fver = data;

        // read FPGA version (for Firmware Rev 5+)
        unsigned long fpga_ver = 1;
        if (fver >= 5) {
            if (!ReadQuadletNode(node, BoardIO::ETH_STATUS, data)) {
                outStr << "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node "
                       << node << std::endl;
                continue;
            }
            fpga_ver = BoardIO::GetFpgaVersionMajorFromStatus(data);
        }

        // read board id
        if (!ReadQuadletNode(node, BoardIO::BOARD_STATUS, data)) {
            outStr << "BasePort::ScanNodes: unable to read status from node " << node << std::endl;
            continue;
        }
        // board_id is bits 27-24, BOARD_ID_MASK = 0x0F000000
        board = (data & BOARD_ID_MASK) >> 24;
        FpgaVersion[board] = fpga_ver;
        HardwareVersion[board] = hver;
        FirmwareVersion[board] = fver;

        // read git description (introduced after Rev 8 release)
        uint32_t git_desc = 0;
        if (!ReadQuadletNode(node, BoardIO::GIT_DESC, git_desc)) {
            outStr << "BasePort::ScanNodes: unable to read git desc from node " << node << std::endl;
        }
        outStr << "  Node " << node << ", BoardId = " << board
               << ", " << GetFpgaVersionMajorString(board)
               << ", Hardware = " << GetHardwareVersionString(board)
               << ", Firmware Version = " << GetFirmwareVersion(board);

        if (git_desc != 0) {
            // git_dirty bit indicates that firmware was built with uncommitted changes;
            // shown by appending * to the git SHA.
            bool git_dirty = git_desc&0x00000008;
            // git_commits bit indicates whether there were any commits since the last tag
            bool git_commits = git_desc&0x00000004;
            // git_flag is set by the firmware, based on comparing the firmware version (F) to
            // the most recent git tag ("RevG", where G is the git tag version)
            //    0:  F == G     actual release ("F") or update to last release ("F+"),
            //                   depending on git_dirty and git_commits
            //    1:  F == G+1   new firmware preview, shown as "F-"
            //    2:  F > G+1    should not happen (missing git tag?), shown as "F?"
            //    3:  F < G      should not happen, shown as "F?"
            uint8_t git_flag = git_desc&0x00000003;
            bool showSHA = true;
            if (git_flag == 0) {
                if (git_dirty|git_commits)
                    outStr << "+";
                else
                    showSHA = false;
            }
            else if (git_flag == 1)
                outStr << "-";
            else
                outStr << "?";
            if (showSHA) {
                outStr << " (git-" << std::hex << std::setw(7) << std::setfill('0')
                       << (git_desc>>4) << std::dec;
                if (git_dirty)
                    outStr << "*";
                outStr << ")";
            }
        }
        outStr << std::endl;

        if (Node2Board[node] < BoardIO::MAX_BOARDS) {
            outStr << "    Duplicate entry, previous value = "
                   << static_cast<int>(Node2Board[node]) << std::endl;
        }
        Node2Board[node] = static_cast<unsigned char>(board);

        // check firmware version
        // Firmware Version >= 4, broadcast capable
        if (fver < 4) {
            IsAllBoardsBroadcastCapable_ = false;
            IsAllBoardsRev4_5_ = false;
            IsAllBoardsRev4_6_ = false;
        }
        if (fver > 5) IsAllBoardsRev4_5_ = false;
        if (fver > 6) IsAllBoardsRev4_6_ = false;
        // Firmware Version 6, broadcast with possibly shorter wait (i.e., skipping nodes
        // on the bus that are not part of the current configuration).
        if (fver != 6) IsAllBoardsRev6_ = false;
        // Firmware Version 7, added power control to block write; added velocity estimation
        // fields to block read
        if (fver != 7) IsAllBoardsRev7_ = false;
        // Firmware Version 8, added header quadlet to block write; support larger entries in
        // block read (both changes to support dRAC).
        if ((fver != 8) && (fver != 9)) IsAllBoardsRev8_9_ = false;
        NumOfNodes_++;
    }
    outStr << "BasePort::ScanNodes: found " << NumOfNodes_ << " boards" << std::endl;

    // update Board2Node
    for (board = 0; board < BoardIO::MAX_BOARDS; board++) {
        Board2Node[board] = MAX_NODES;
        // search up to max_nodes (not NumOfNodes_) in case nodes are not sequential (i.e., if some nodes
        // are not associated with valid boards).
        for (node = 0; node < max_nodes; node++) {
            if (Node2Board[node] == board) {
                if (Board2Node[board] < MAX_NODES)
                    outStr << "BasePort::ScanNodes: warning: duplicate node id for board " << board
                           << "(" << Board2Node[board] << ", " << node << ")" << std::endl;
                Board2Node[board] = node;
            }
        }
    }

    return (NumOfNodes_ > 0);
}